

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

void Wlc_BlastReduceMatrix
               (Gia_Man_t *pNew,Vec_Wec_t *vProds,Vec_Wec_t *vLevels,Vec_Int_t *vRes,int fSigned,
               int fCla)

{
  ulong uVar1;
  uint uVar2;
  int b;
  int iVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  Vec_Int_t *pVVar10;
  Vec_Int_t *pVVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int NodeC;
  int NodeS;
  int local_60;
  int local_5c;
  ulong local_58;
  Vec_Wec_t *local_50;
  Vec_Wec_t *local_48;
  long local_40;
  ulong local_38;
  
  uVar12 = vProds->nSize;
  uVar2 = vLevels->nSize;
  if (uVar12 != uVar2) {
    __assert_fail("nSize == Vec_WecSize(vLevels)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                  ,0x363,
                  "void Wlc_BlastReduceMatrix(Gia_Man_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, int, int)"
                 );
  }
  if (0 < (int)uVar12) {
    uVar8 = (ulong)uVar12;
    uVar13 = 0;
    local_58 = (ulong)uVar12;
    local_50 = vLevels;
    local_48 = vProds;
    do {
      if ((long)(int)uVar8 <= (long)uVar13) goto LAB_0089f031;
      uVar1 = uVar13 + 1;
      iVar15 = vProds->pArray[uVar13].nSize;
      if (2 < iVar15) {
        pVVar10 = vProds->pArray + uVar13;
        local_40 = uVar13 * 0x10;
        local_38 = uVar13;
        do {
          piVar5 = pVVar10->pArray;
          pVVar10->nSize = iVar15 - 1U;
          iVar7 = piVar5[iVar15 - 1U];
          pVVar10->nSize = iVar15 - 2U;
          b = piVar5[iVar15 - 2U];
          pVVar10->nSize = iVar15 - 3U;
          if ((long)vLevels->nSize <= (long)local_38) goto LAB_0089f031;
          iVar3 = *(int *)((long)&vLevels->pArray->nSize + local_40);
          if (iVar3 < 1) {
LAB_0089f05a:
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
          }
          iVar15 = piVar5[iVar15 - 3U];
          pVVar11 = (Vec_Int_t *)((long)&vLevels->pArray->nCap + local_40);
          piVar5 = pVVar11->pArray;
          uVar12 = iVar3 - 1;
          pVVar11->nSize = uVar12;
          if (uVar12 == 0) goto LAB_0089f05a;
          iVar4 = piVar5[uVar12];
          uVar12 = iVar3 - 2;
          pVVar11->nSize = uVar12;
          if (uVar12 == 0) goto LAB_0089f05a;
          iVar9 = piVar5[uVar12];
          pVVar11->nSize = iVar3 - 3U;
          iVar3 = piVar5[iVar3 - 3U];
          Wlc_BlastFullAdder(pNew,iVar7,b,iVar15,&local_60,&local_5c);
          if (iVar9 < iVar4) {
            iVar9 = iVar4;
          }
          if (iVar9 <= iVar3) {
            iVar9 = iVar3;
          }
          Wlc_IntInsert(pVVar10,pVVar11,local_5c,iVar9 + 2);
          vProds = local_48;
          vLevels = local_50;
          if (((long)local_48->nSize <= (long)uVar1) || ((long)local_50->nSize <= (long)uVar1))
          goto LAB_0089f031;
          Wlc_IntInsert(local_48->pArray + uVar1,local_50->pArray + uVar1,local_60,iVar9 + 1);
          uVar8 = (ulong)vProds->nSize;
          if ((long)uVar8 <= (long)local_38) goto LAB_0089f031;
          iVar15 = *(int *)((long)&vProds->pArray->nSize + local_40);
          pVVar10 = (Vec_Int_t *)((long)&vProds->pArray->nCap + local_40);
        } while (2 < iVar15);
      }
      uVar6 = local_58;
      uVar13 = uVar1;
    } while (uVar1 != local_58);
    iVar15 = (int)local_58;
    if (0 < iVar15) {
      uVar13 = 0;
      do {
        if ((long)vProds->nSize <= (long)uVar13) goto LAB_0089f031;
        iVar7 = vProds->pArray[uVar13].nSize;
        if (iVar7 < 2) {
          pVVar10 = vProds->pArray + uVar13;
          do {
            Vec_IntPush(pVVar10,0);
            iVar7 = pVVar10->nSize;
          } while (iVar7 < 2);
        }
        if (iVar7 != 2) {
          __assert_fail("Vec_IntSize(vProd) == 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcBlast.c"
                        ,0x389,
                        "void Wlc_BlastReduceMatrix(Gia_Man_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, int, int)"
                       );
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar6);
      if (local_50->nSize < 1) goto LAB_0089f031;
      pVVar10 = local_50->pArray;
      vRes->nSize = 0;
      pVVar10->nSize = 0;
      if (0 < iVar15) {
        lVar14 = 8;
        uVar13 = 0;
        do {
          if ((long)local_48->nSize <= (long)uVar13) goto LAB_0089f031;
          pVVar11 = local_48->pArray;
          if ((*(int *)((long)pVVar11 + lVar14 + -4) < 1) ||
             (Vec_IntPush(vRes,**(int **)((long)&pVVar11->nCap + lVar14)),
             *(int *)((long)pVVar11 + lVar14 + -4) < 2)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          Vec_IntPush(pVVar10,*(int *)(*(long *)((long)&pVVar11->nCap + lVar14) + 4));
          uVar13 = uVar13 + 1;
          lVar14 = lVar14 + 0x10;
        } while (local_58 != uVar13);
      }
      goto LAB_0089efc7;
    }
    uVar2 = vLevels->nSize;
  }
  if ((int)uVar2 < 1) {
LAB_0089f031:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  pVVar10 = vLevels->pArray;
  vRes->nSize = 0;
  pVVar10->nSize = 0;
LAB_0089efc7:
  Vec_IntPush(vRes,0);
  Vec_IntPush(pVVar10,0);
  if (fCla != 0) {
    Wlc_BlastAdderCLA(pNew,vRes->pArray,pVVar10->pArray,vRes->nSize,fSigned,0);
    return;
  }
  Wlc_BlastAdder(pNew,vRes->pArray,pVVar10->pArray,vRes->nSize,0);
  return;
}

Assistant:

void Wlc_BlastReduceMatrix( Gia_Man_t * pNew, Vec_Wec_t * vProds, Vec_Wec_t * vLevels, Vec_Int_t * vRes, int fSigned, int fCla )
{
    Vec_Int_t * vLevel, * vProd;
    int i, NodeS, NodeC, LevelS, LevelC, Node1, Node2, Node3, Level1, Level2, Level3;
    int nSize = Vec_WecSize(vProds);
    assert( nSize == Vec_WecSize(vLevels) );
    for ( i = 0; i < nSize; i++ )
    {
        while ( 1 )
        {
            vProd  = Vec_WecEntry( vProds, i );
            if ( Vec_IntSize(vProd) < 3 )
                break;

            Node1  = Vec_IntPop( vProd );
            Node2  = Vec_IntPop( vProd );
            Node3  = Vec_IntPop( vProd );

            vLevel = Vec_WecEntry( vLevels, i );

            Level1 = Vec_IntPop( vLevel );
            Level2 = Vec_IntPop( vLevel );
            Level3 = Vec_IntPop( vLevel );

            Wlc_BlastFullAdder( pNew, Node1, Node2, Node3, &NodeC, &NodeS );
            LevelS = Abc_MaxInt( Abc_MaxInt(Level1, Level2), Level3 ) + 2;
            LevelC = LevelS - 1;

            Wlc_IntInsert( vProd, vLevel, NodeS, LevelS );

            vProd  = Vec_WecEntry( vProds, i+1 );
            vLevel = Vec_WecEntry( vLevels, i+1 );

            Wlc_IntInsert( vProd, vLevel, NodeC, LevelC );
        }
    }

    // make all ranks have two products
    for ( i = 0; i < nSize; i++ )
    {
        vProd  = Vec_WecEntry( vProds, i );
        while ( Vec_IntSize(vProd) < 2 )
            Vec_IntPush( vProd, 0 );
        assert( Vec_IntSize(vProd) == 2 );
    }
//    Vec_WecPrint( vProds, 0 );

    vLevel = Vec_WecEntry( vLevels, 0 );
    Vec_IntClear( vRes );
    Vec_IntClear( vLevel );
    for ( i = 0; i < nSize; i++ )
    {
        vProd  = Vec_WecEntry( vProds, i );
        Vec_IntPush( vRes,   Vec_IntEntry(vProd, 0) );
        Vec_IntPush( vLevel, Vec_IntEntry(vProd, 1) );
    }
    Vec_IntPush( vRes,   0 );
    Vec_IntPush( vLevel, 0 );

    if ( fCla )
        Wlc_BlastAdderCLA( pNew, Vec_IntArray(vRes), Vec_IntArray(vLevel), Vec_IntSize(vRes), fSigned, 0 );
    else
        Wlc_BlastAdder( pNew, Vec_IntArray(vRes), Vec_IntArray(vLevel), Vec_IntSize(vRes), 0 );
}